

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O2

bool __thiscall QWidgetResizeHandler::eventFilter(QWidgetResizeHandler *this,QObject *o,QEvent *ee)

{
  QWidget *pQVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  QWidget *pQVar5;
  QPoint QVar6;
  byte bVar7;
  QMouseEvent *e;
  long in_FS_OFFSET;
  QRect QVar8;
  QPoint local_70;
  QMargins local_68;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)this[0x40] & 4) != 0) {
    cVar2 = '\0';
    if ((0x33 < (ulong)*(ushort *)(ee + 8)) ||
       ((0x800000000006cU >> ((ulong)*(ushort *)(ee + 8) & 0x3f) & 1) == 0)) goto LAB_004333f0;
    pQVar1 = *(QWidget **)(this + 0x10);
    pQVar5 = QApplication::activePopupWidget();
    if (pQVar5 == (QWidget *)0x0) {
      switch(*(short *)(ee + 8)) {
      case 2:
        bVar4 = QWidget::isMaximized(pQVar1);
        if (!bVar4) {
          local_58 = QWidget::rect(*(QWidget **)(this + 0x10));
          local_68.m_right.m_i = *(int *)(this + 0x3c);
          local_68.m_top.m_i = local_68.m_right.m_i;
          local_68.m_left.m_i = local_68.m_right.m_i;
          local_68.m_bottom.m_i = local_68.m_right.m_i;
          local_48 = QRect::marginsAdded(&local_58,&local_68);
          pQVar1 = *(QWidget **)(this + 0x10);
          local_58 = (QRect)QSinglePointEvent::globalPosition((QSinglePointEvent *)ee);
          local_70 = QPointF::toPoint((QPointF *)&local_58);
          local_68._0_8_ = QWidget::mapFromGlobal(pQVar1,&local_70);
          cVar2 = QRect::contains((QPoint *)&local_48,SUB81(&local_68,0));
          if (cVar2 == '\0') goto LAB_004333f0;
          if (*(int *)(ee + 0x40) != 1) break;
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe);
          activate(this);
          mouseMoveEvent(this,(QMouseEvent *)ee);
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] | 1);
          pQVar1 = *(QWidget **)(this + 0x10);
          local_58 = (QRect)QSinglePointEvent::globalPosition((QSinglePointEvent *)ee);
          local_70 = QPointF::toPoint((QPointF *)&local_58);
          QVar6 = QWidget::mapFromGlobal(pQVar1,&local_70);
          *(QPoint *)(this + 0x20) = QVar6;
          QVar8 = QWidget::rect(*(QWidget **)(this + 0x10));
          *(ulong *)(this + 0x28) =
               CONCAT44(QVar8.y2.m_i.m_i - *(int *)(this + 0x24),
                        QVar8.x2.m_i.m_i - *(int *)(this + 0x20));
LAB_004333e8:
          if (*(int *)(this + 0x30) != 9) goto LAB_004333f0;
        }
        break;
      case 3:
        bVar4 = QWidget::isMaximized(pQVar1);
        if ((!bVar4) && (*(int *)(ee + 0x40) == 1)) {
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfc);
          QWidget::releaseMouse(*(QWidget **)(this + 0x10));
          QWidget::releaseKeyboard(*(QWidget **)(this + 0x10));
LAB_004333e5:
          cVar2 = '\x01';
          goto LAB_004333e8;
        }
        break;
      case 4:
        break;
      case 5:
        bVar4 = QWidget::isMaximized(pQVar1);
        if (!bVar4) {
          if (((byte)this[0x40] & 1) == 0) {
            bVar7 = 0;
          }
          else {
            bVar7 = (byte)ee[0x44] & 1;
          }
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe | bVar7);
          mouseMoveEvent(this,(QMouseEvent *)ee);
          goto LAB_004333e5;
        }
        break;
      case 6:
        keyPressEvent(this,(QKeyEvent *)ee);
        break;
      default:
        if (*(short *)(ee + 8) == 0x33) {
          bVar3 = QGuiApplication::mouseButtons();
          bVar7 = (byte)this[0x40] & 1;
          if ((bVar3 & 1) == 0) {
            bVar7 = 0;
          }
          this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe | bVar7);
          if (bVar7 != 0) {
            ee[0xc] = (QEvent)0x1;
            cVar2 = '\x01';
            goto LAB_004333f0;
          }
        }
      }
    }
    else if ((((byte)this[0x40] & 1) != 0) && (*(short *)(ee + 8) == 3)) {
      this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe);
    }
  }
  cVar2 = '\0';
LAB_004333f0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)cVar2;
}

Assistant:

bool QWidgetResizeHandler::eventFilter(QObject *o, QEvent *ee)
{
    if (!isEnabled()
        || (ee->type() != QEvent::MouseButtonPress
            && ee->type() != QEvent::MouseButtonRelease
            && ee->type() != QEvent::MouseMove
            && ee->type() != QEvent::KeyPress
            && ee->type() != QEvent::ShortcutOverride)
        )
        return false;

    Q_ASSERT(o == widget);
    QWidget *w = widget;
    if (QApplication::activePopupWidget()) {
        if (buttonDown && ee->type() == QEvent::MouseButtonRelease)
            buttonDown = false;
        return false;
    }

    switch (ee->type()) {
    case QEvent::MouseButtonPress: {
        QMouseEvent *e = static_cast<QMouseEvent *>(ee);
        if (w->isMaximized())
            break;
        const QRect widgetRect = widget->rect().marginsAdded(QMargins(range, range, range, range));
        const QPoint cursorPoint = widget->mapFromGlobal(e->globalPosition().toPoint());
        if (!widgetRect.contains(cursorPoint))
            return false;
        if (e->button() == Qt::LeftButton) {
            buttonDown = false;
            emit activate();
            mouseMoveEvent(e);
            buttonDown = true;
            moveOffset = widget->mapFromGlobal(e->globalPosition().toPoint());
            invertedMoveOffset = widget->rect().bottomRight() - moveOffset;
            if (mode != Center)
                return true;
        }
    } break;
    case QEvent::MouseButtonRelease:
        if (w->isMaximized())
            break;
        if (static_cast<QMouseEvent *>(ee)->button() == Qt::LeftButton) {
            active = false;
            buttonDown = false;
            widget->releaseMouse();
            widget->releaseKeyboard();
            if (mode != Center)
                return true;
        }
        break;
    case QEvent::MouseMove: {
        if (w->isMaximized())
            break;
        QMouseEvent *e = static_cast<QMouseEvent *>(ee);
        buttonDown = buttonDown && (e->buttons() & Qt::LeftButton); // safety, state machine broken!
        mouseMoveEvent(e);
        if (mode != Center)
            return true;
    } break;
    case QEvent::KeyPress:
        keyPressEvent(static_cast<QKeyEvent *>(ee));
        break;
    case QEvent::ShortcutOverride:
        buttonDown &= ((QGuiApplication::mouseButtons() & Qt::LeftButton) != Qt::NoButton);
        if (buttonDown) {
            ee->accept();
            return true;
        }
        break;
    default:
        break;
    }

    return false;
}